

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

string * __thiscall
MinVR::VRDataIndex::
addDataSpecialized<std::vector<float,std::allocator<float>>,(MinVR::VRCORETYPE_ID)5>
          (VRDataIndex *this,string *key,vector<float,_std::allocator<float>_> *value)

{
  int iVar1;
  char *pcVar2;
  runtime_error *this_00;
  allocator<char> *in_RCX;
  undefined1 uVar3;
  VRDataIndex *in_RDX;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  *in_RSI;
  string *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_bool>
  pVar4;
  VRContainer *in_stack_00000088;
  string *in_stack_00000090;
  VRDataIndex *in_stack_00000098;
  string ns;
  VRContainer cValue;
  VRDatumPtr obj;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>,_bool>
  res;
  string *fixedValName;
  VRDatumPtr *in_stack_fffffffffffffdb8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  *in_stack_fffffffffffffdc0;
  value_type *in_stack_fffffffffffffdc8;
  string *psVar5;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  VRDatum *in_stack_fffffffffffffdd8;
  string *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  *p;
  string local_1e0 [24];
  string *in_stack_fffffffffffffe38;
  string local_180 [32];
  string local_160 [32];
  string local_140 [8];
  void *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  VRDatumFactory *in_stack_fffffffffffffed8;
  allocator<char> local_69;
  string *in_stack_ffffffffffffff98;
  string local_48 [39];
  undefined1 local_21;
  
  local_21 = 0;
  this_01 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,(string *)in_RDX);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
  if (*pcVar2 != '/') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,in_RCX);
    std::operator+(&in_stack_fffffffffffffdc8->first,&in_stack_fffffffffffffdc0->first);
    std::__cxx11::string::operator=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator(&local_69);
  }
  p = in_RSI;
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)in_RSI,in_stack_fffffffffffffdd8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MinVR::VRDatumPtr,_true>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffdd8,
             (VRDatumPtr *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  pVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdc8);
  uVar3 = pVar4.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>
  ::~pair(in_stack_fffffffffffffdc0);
  VRDatumPtr::~VRDatumPtr((VRDatumPtr *)CONCAT17(uVar3,in_stack_fffffffffffffdd0));
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(int *)&p[1].second.reference < 1) {
      if (*(int *)&p[1].second.reference == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,in_RCX);
        std::runtime_error::runtime_error(this_00,local_1e0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                    *)0x14e5ad);
      VRDatumPtr::VRDatumPtr((VRDatumPtr *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)in_RDX,
                 (vector<float,_std::allocator<float>_> *)p);
      _setValueSpecialized(in_RDX,(VRDatumPtr *)p,(VRFloatArray *)this_01);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)CONCAT17(uVar3,in_stack_fffffffffffffdd0))
      ;
      VRDatumPtr::~VRDatumPtr((VRDatumPtr *)CONCAT17(uVar3,in_stack_fffffffffffffdd0));
    }
  }
  else {
    VRDatumFactory::CreateVRDatum
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                  *)0x14e2f8);
    VRDatumPtr::operator=
              ((VRDatumPtr *)CONCAT17(uVar3,in_stack_fffffffffffffdd0),
               (VRDatumPtr *)in_stack_fffffffffffffdc8);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14e31b);
    _explodeName(in_stack_ffffffffffffff98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffdc0);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(uVar3,in_stack_fffffffffffffdd0),&in_stack_fffffffffffffdc8->first);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(uVar3,in_stack_fffffffffffffdd0));
    _getNameSpace(in_stack_fffffffffffffe38);
    iVar1 = std::__cxx11::string::compare((char *)local_140);
    if (iVar1 != 0) {
      psVar5 = local_140;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_180,(ulong)psVar5);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_RDI);
      addData(in_stack_00000098,in_stack_00000090,in_stack_00000088);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x14e411);
      std::__cxx11::string::~string(local_180);
    }
    std::__cxx11::string::~string(local_140);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x14e553);
    VRDatumPtr::~VRDatumPtr((VRDatumPtr *)CONCAT17(uVar3,in_stack_fffffffffffffdd0));
  }
  return this_01;
}

Assistant:

std::string addDataSpecialized(const std::string key, T value) {

    // All names must be in some namespace. If there is no namespace,
    // put this into the root namespace.
    std::string fixedValName = key;
    if (key[0] != '/') fixedValName = std::string("/") + key;

    std::pair<VRDataMap::iterator, bool>res =
      _theIndex.insert(VRDataMap::value_type(fixedValName, (VRDatumPtr)NULL));

    // Was it already used?
    if (res.second) {

      VRDatumPtr obj = _factory.CreateVRDatum(TID, &value);
      res.first->second = obj;

      // Add this value to the parent container, if any.
      VRContainer cValue;
      cValue.push_back(_explodeName(fixedValName).back());
      std::string ns = _getNameSpace(fixedValName);
      // The parent container is the namespace minus the trailing /.
      if (ns.compare("/") != 0) addData(ns.substr(0, ns.size() - 1), cValue);

    } else {

      // Entry already exists. Decide whether to modify or throw an exception.
      if (_overwrite > 0) {

        _setValueSpecialized(res.first->second, (T)value);

      } else if (_overwrite == 0) {

        throw std::runtime_error(std::string("overwriting values not allowed"));
      }
    }

    return fixedValName;
  }